

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basicGenerators.h
# Opt level: O0

Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SaadAttieh[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>
* __thiscall
LazyCode::read<int,std::ifstream>
          (Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SaadAttieh[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>
           *__return_storage_ptr__,LazyCode *this,
          basic_ifstream<char,_std::char_traits<char>_> *stream)

{
  Reader local_240;
  LazyCode *local_18;
  basic_ifstream<char,_std::char_traits<char>_> *stream_local;
  
  local_18 = this;
  stream_local = (basic_ifstream<char,_std::char_traits<char>_> *)__return_storage_ptr__;
  read<int,std::ifstream>(std::ifstream&&)::Reader::Reader(std::ifstream___
            (&local_240,(basic_ifstream<char,_std::char_traits<char>_> *)this);
  generator<LazyCode::read<int,std::ifstream>(std::ifstream&&)::Reader,LazyCode::read<int,std::ifstream>(std::ifstream&&)::_lambda(auto:1&&)_1_>
            (__return_storage_ptr__,(LazyCode *)&local_240);
  Reader::~Reader(&local_240);
  return __return_storage_ptr__;
}

Assistant:

auto read(Stream&& stream) {
    struct Reader {
        Stream stream;
        std::istream_iterator<ReadType> first;
        std::istream_iterator<ReadType> last;
        Reader(Stream&& stream)
            : stream(std::forward<Stream>(stream)), first(this->stream) {}
    };
    return generator(Reader(std::forward<Stream>(stream)),
                     [](auto&& reader) mutable -> optional<ReadType> {
                         if (reader.first == reader.last) {
                             return nullopt;
                         }
                         decltype(auto) val = *reader.first;
                         ++reader.first;
                         return val;
                     });
}